

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

uint64_t __thiscall google::protobuf::internal::SerialArena::SpaceUsed(SerialArena *this)

{
  bool bVar1;
  atomic<unsigned_long> *paVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  unsigned_long *puVar6;
  StringBlock *pSVar7;
  unsigned_long local_78;
  unsigned_long local_70;
  uint64_t current_block_size;
  ArenaBlock *h;
  size_t unused;
  StringBlock *sb;
  uint64_t space_used;
  SerialArena *this_local;
  __int_type_conflict3 local_38;
  int local_2c;
  memory_order __b_1;
  ArenaBlock *local_20;
  memory_order local_18;
  int local_14;
  memory_order __b;
  
  sb = (StringBlock *)0x0;
  space_used = (uint64_t)this;
  unused = (size_t)std::atomic<google::protobuf::internal::StringBlock_*>::load
                             (&this->string_block_,memory_order_acquire);
  if ((__pointer_type)unused != (__pointer_type)0x0) {
    paVar2 = &this->string_block_unused_;
    local_14 = 0;
    ___b = paVar2;
    local_18 = std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_14 - 1U < 2) {
      local_20 = (ArenaBlock *)(paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_14 == 5) {
      local_20 = (ArenaBlock *)(paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_20 = (ArenaBlock *)(paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    h = local_20;
    sVar3 = StringBlock::effective_size((StringBlock *)unused);
    sb = (StringBlock *)((sVar3 - (long)h) + (long)sb);
  }
  current_block_size =
       (uint64_t)
       std::atomic<google::protobuf::internal::ArenaBlock_*>::load
                 (&this->head_,memory_order_acquire);
  bVar1 = ArenaBlock::IsSentry((ArenaBlock *)current_block_size);
  if (bVar1) {
    this_local = (SerialArena *)sb;
  }
  else {
    local_70 = *(unsigned_long *)(current_block_size + 8);
    pcVar4 = ptr(this);
    pcVar5 = ArenaBlock::Pointer((ArenaBlock *)current_block_size,0x10);
    local_78 = (long)pcVar4 - (long)pcVar5;
    puVar6 = std::min<unsigned_long>(&local_78,&local_70);
    pSVar7 = (StringBlock *)((long)&sb->next_ + *puVar6);
    paVar2 = &this->space_used_;
    local_2c = 0;
    sb = pSVar7;
    ___b_1 = paVar2;
    std::operator&(memory_order_relaxed,__memory_order_mask);
    if (local_2c - 1U < 2) {
      local_38 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else if (local_2c == 5) {
      local_38 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    else {
      local_38 = (paVar2->super___atomic_base<unsigned_long>)._M_i;
    }
    this_local = (SerialArena *)((long)&pSVar7->next_ + local_38);
  }
  return (uint64_t)this_local;
}

Assistant:

uint64_t SerialArena::SpaceUsed() const {
  // Note: the calculation below technically causes a race with
  // AllocateNewBlock when called from another thread (which happens in
  // ThreadSafeArena::SpaceUsed).  However, worst-case space_used_ will have
  // stale data and the calculation will incorrectly assume 100%
  // usage of the *current* block.
  // TODO Consider eliminating this race in exchange for a possible
  // performance hit on ARM (see cl/455186837).

  uint64_t space_used = 0;
  StringBlock* sb = string_block_.load(std::memory_order_acquire);
  if (sb) {
    size_t unused = string_block_unused_.load(std::memory_order_relaxed);
    space_used += sb->effective_size() - unused;
  }
  const ArenaBlock* h = head_.load(std::memory_order_acquire);
  if (h->IsSentry()) return space_used;

  const uint64_t current_block_size = h->size;
  space_used += std::min(
      static_cast<uint64_t>(
          ptr() - const_cast<ArenaBlock*>(h)->Pointer(kBlockHeaderSize)),
      current_block_size);
  return space_used + space_used_.load(std::memory_order_relaxed);
}